

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcircuit.cpp
# Opt level: O1

bool __thiscall
SubCircuit<4>::exploreSubtree
          (SubCircuit<4> *this,int thisNode,int startPrevSubtree,int endPrevSubtree,int *backfrom,
          int *backto,int *numback)

{
  uint uVar1;
  int *piVar2;
  IntVar *pIVar3;
  bool bVar4;
  Lit LVar5;
  uint uVar6;
  int iVar7;
  Lit LVar8;
  int iVar9;
  Clause *pCVar10;
  Tchar *pTVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [8];
  vec<int> *pvVar15;
  IntView<4> *pIVar16;
  int thisNode_00;
  long lVar17;
  long lVar18;
  vec<int> prevAndLater;
  vec<int> outside;
  vec<int> inside;
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  bool local_1a8;
  vec<int> local_198;
  Clause *local_188;
  int *piStack_180;
  uint local_174;
  int local_170;
  int local_16c;
  int **local_168;
  Clause *local_160;
  vec<int> *local_158;
  IntView<4> *local_150;
  vec<int> local_148;
  vec<SubCircuit<4>::PROP> *local_138;
  vec<int> local_100;
  vec<int> local_f0;
  vec<int> local_e0;
  vec<int> local_d0;
  vec<int> local_c0;
  vec<int> local_b0;
  vec<int> *local_a0;
  vec<int> *local_98;
  int *local_90;
  int *local_88;
  IntVar *local_80;
  vec<int> local_78;
  vec<int> local_68;
  vec<int> local_58;
  vec<int> local_48;
  long local_38;
  
  iVar7 = this->nodesSeen;
  this->nodesSeen = iVar7 + 1;
  piVar2 = this->index;
  piVar2[thisNode] = iVar7;
  this->lowlink[thisNode] = piVar2[thisNode];
  local_80 = this->x[thisNode].var;
  pIVar16 = this->x + thisNode;
  local_98 = &this->prev;
  local_158 = &this->later;
  local_a0 = &this->earlier;
  local_138 = &this->propQueue;
  local_168 = &local_c0.data;
  local_174 = (uint)CONCAT71((int7)((ulong)local_168 >> 8),1);
  iVar7 = (local_80->min).v;
  local_170 = startPrevSubtree;
  local_16c = endPrevSubtree;
  local_150 = pIVar16;
  local_90 = backfrom;
  local_88 = backto;
  do {
    iVar9 = iVar7;
    pvVar15 = local_98;
    local_38 = (long)iVar9;
    lVar17 = pIVar16->b + local_38;
    piVar2 = this->index;
    iVar7 = piVar2[lVar17];
    thisNode_00 = (int)lVar17;
    if (iVar7 == -1) {
      bVar4 = exploreSubtree(this,thisNode_00,local_170,local_16c,local_90,local_88,numback);
      if (!bVar4) {
        return false;
      }
      piVar2 = this->lowlink;
      if (piVar2[lVar17] < piVar2[thisNode]) {
        piVar2[thisNode] = piVar2[lVar17];
      }
      if (((this->pruneWithin == true) && ((local_174 & 1) != 0)) &&
         (piVar2[lVar17] == this->index[thisNode])) {
        local_188 = (Clause *)0x0;
        piStack_180 = (int *)0x0;
        local_198.sz = 0;
        local_198.cap = 0;
        local_198.data = (int *)0x0;
        local_1b8 = (undefined1  [8])((ulong)local_1b8 & 0xffffffff00000000);
        if (0 < *(int *)&(this->super_Propagator).field_0x14) {
          iVar7 = 0;
          do {
            piVar2 = this->index;
            pvVar15 = (vec<int> *)&local_188;
            if ((piVar2[lVar17] <= piVar2[iVar7]) ||
               (pvVar15 = &local_198, piVar2[iVar7] != piVar2[thisNode])) {
              vec<int>::push(pvVar15,(int *)local_1b8);
            }
            iVar7 = local_1b8._0_4_ + 1;
            local_1b8._0_4_ = iVar7;
          } while (iVar7 < *(int *)&(this->super_Propagator).field_0x14);
        }
        uVar13 = (ulong)local_188 & 0xffffffff;
        local_148.sz = (uint)local_188;
        local_148.cap = (uint)local_188;
        local_148.data = (int *)malloc(uVar13 * 4);
        if (uVar13 != 0) {
          uVar12 = 0;
          do {
            local_148.data[uVar12] = piStack_180[uVar12];
            uVar12 = uVar12 + 1;
          } while (uVar13 != uVar12);
        }
        LVar5 = getEvidenceLit(this,&local_148);
        if (local_148.data != (int *)0x0) {
          free(local_148.data);
        }
        local_148.data = (int *)0x0;
        uVar13 = local_198._0_8_ & 0xffffffff;
        local_b0.sz = local_198.sz;
        local_b0.cap = local_198.sz;
        local_b0.data = (int *)malloc(uVar13 * 4);
        if (uVar13 != 0) {
          uVar12 = 0;
          do {
            local_b0.data[uVar12] = local_198.data[uVar12];
            uVar12 = uVar12 + 1;
          } while (uVar13 != uVar12);
        }
        LVar8 = getEvidenceLit(this,&local_b0);
        if (local_b0.data != (int *)0x0) {
          free(local_b0.data);
        }
        local_b0.data = (int *)0x0;
        if (LVar8.x != 1) {
          if (so.lazy == true) {
            iVar7 = local_198.sz * (uint)local_188 + 2;
            local_1b8 = (undefined1  [8])malloc((long)iVar7 * 4 + 8);
            *(uint *)local_1b8 = (*(uint *)local_1b8 & 0xfc) + iVar7 * 0x100 + 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)local_1b8);
            auVar14 = local_1b8;
            if (*(uint *)local_1b8 < 0x200) goto LAB_001493be;
            *(int *)((long)local_1b8 + 8) = LVar8.x;
            uVar13 = (ulong)local_188 & 0xffffffff;
            local_c0.sz = (uint)local_188;
            local_c0.cap = (uint)local_188;
            local_c0.data = (int *)malloc(uVar13 * 4);
            if (uVar13 != 0) {
              uVar12 = 0;
              do {
                local_c0.data[uVar12] = piStack_180[uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar13 != uVar12);
            }
            uVar13 = local_198._0_8_ & 0xffffffff;
            local_d0.sz = local_198.sz;
            local_d0.cap = local_198.sz;
            local_d0.data = (int *)malloc(uVar13 * 4);
            if (uVar13 != 0) {
              uVar12 = 0;
              do {
                local_d0.data[uVar12] = local_198.data[uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar13 != uVar12);
            }
            explainAcantreachB(this,(Clause *)auVar14,2,&local_c0,&local_d0,-1,-1);
            if (local_d0.data != (int *)0x0) {
              free(local_d0.data);
            }
            local_d0.data = (int *)0x0;
            if (local_c0.data != (int *)0x0) {
              free(local_c0.data);
            }
            local_c0.data = (int *)0x0;
          }
          else {
            auVar14 = (undefined1  [8])0x0;
          }
          uStack_1b0 = (int *)CONCAT44(thisNode_00,thisNode);
          local_1a8 = false;
          local_1b8 = auVar14;
          vec<SubCircuit<4>::PROP>::push(local_138,(PROP *)local_1b8);
        }
        if (LVar5.x != 1) {
          if (so.lazy == true) {
            iVar7 = local_198.sz * (uint)local_188 + 2;
            local_1b8 = (undefined1  [8])malloc((long)iVar7 * 4 + 8);
            *(uint *)local_1b8 = (*(uint *)local_1b8 & 0xfc) + iVar7 * 0x100 + 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)local_1b8);
            auVar14 = local_1b8;
            if (*(uint *)local_1b8 < 0x200) {
LAB_001493be:
              abort();
            }
            *(int *)((long)local_1b8 + 8) = LVar5.x;
            uVar13 = (ulong)local_188 & 0xffffffff;
            local_e0.sz = (uint)local_188;
            local_e0.cap = (uint)local_188;
            local_e0.data = (int *)malloc(uVar13 * 4);
            if (uVar13 != 0) {
              uVar12 = 0;
              do {
                local_e0.data[uVar12] = piStack_180[uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar13 != uVar12);
            }
            uVar13 = local_198._0_8_ & 0xffffffff;
            local_f0.sz = local_198.sz;
            local_f0.cap = local_198.sz;
            local_f0.data = (int *)malloc(uVar13 * 4);
            if (uVar13 != 0) {
              uVar12 = 0;
              do {
                local_f0.data[uVar12] = local_198.data[uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar13 != uVar12);
            }
            explainAcantreachB(this,(Clause *)auVar14,2,&local_e0,&local_f0,-1,-1);
            if (local_f0.data != (int *)0x0) {
              free(local_f0.data);
            }
            local_f0.data = (int *)0x0;
            if (local_e0.data != (int *)0x0) {
              free(local_e0.data);
            }
            local_e0.data = (int *)0x0;
          }
          else {
            auVar14 = (undefined1  [8])0x0;
          }
          if (local_198.sz != 0) {
            uVar13 = 0;
            do {
              iVar7 = local_198.data[uVar13];
              lVar17 = (long)thisNode - (long)this->x[iVar7].b;
              pIVar3 = this->x[iVar7].var;
              if ((((pIVar3->min).v <= lVar17) && (lVar17 <= (pIVar3->max).v)) &&
                 ((pIVar3->vals == (Tchar *)0x0 || (pIVar3->vals[lVar17].v != '\0')))) {
                uStack_1b0 = (int *)CONCAT44(thisNode,iVar7);
                local_1a8 = false;
                local_1b8 = auVar14;
                vec<SubCircuit<4>::PROP>::push(local_138,(PROP *)local_1b8);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < (local_198._0_8_ & 0xffffffff));
          }
        }
        if (local_198.data != (int *)0x0) {
          free(local_198.data);
        }
        if (piStack_180 != (int *)0x0) {
          free(piStack_180);
        }
        local_174 = 0;
        pIVar16 = local_150;
      }
      else {
        local_174 = 0;
        pIVar16 = local_150;
      }
    }
    else if (thisNode_00 != thisNode) {
      if (iVar7 <= local_16c && local_170 <= iVar7) {
        *numback = *numback + 1;
        *local_90 = thisNode;
        *local_88 = thisNode_00;
      }
      if ((this->pruneSkip == true) && (piVar2[lVar17] < local_170)) {
        vec<int>::vec<int>(&local_48,local_98);
        LVar5 = getEvidenceLit(this,&local_48);
        if (local_48.data != (int *)0x0) {
          free(local_48.data);
        }
        local_48.data = (int *)0x0;
        pIVar16 = local_150;
        if (LVar5.x != 1) {
          if (so.lazy == true) {
            local_160 = (Clause *)CONCAT44(local_160._4_4_,LVar5.x);
            local_1b8 = (undefined1  [8])0x0;
            uStack_1b0 = (int *)0x0;
            vec<int>::reserve((vec<int> *)local_1b8,local_158->sz + pvVar15->sz);
            if (pvVar15->sz != 0) {
              lVar18 = 0;
              uVar13 = 0;
              do {
                vec<int>::push((vec<int> *)local_1b8,(int *)((long)(this->prev).data + lVar18));
                uVar13 = uVar13 + 1;
                lVar18 = lVar18 + 4;
              } while (uVar13 < (this->prev).sz);
            }
            uVar6 = local_158->sz;
            if (uVar6 != 0) {
              lVar18 = 0;
              uVar13 = 0;
              do {
                vec<int>::push((vec<int> *)local_1b8,(int *)((long)(this->later).data + lVar18));
                uVar13 = uVar13 + 1;
                uVar6 = (this->later).sz;
                lVar18 = lVar18 + 4;
              } while (uVar13 < uVar6);
            }
            pvVar15 = local_98;
            iVar7 = uVar6 * local_98->sz + local_1b8._0_4_ * local_a0->sz + 2;
            local_188 = (Clause *)malloc((long)iVar7 * 4 + 8);
            *(uint *)local_188 = (*(uint *)local_188 & 0xfc) + iVar7 * 0x100 + 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_188);
            pCVar10 = local_188;
            if (*(uint *)local_188 < 0x200) goto LAB_001493be;
            *(undefined4 *)(local_188 + 1) = local_160._0_4_;
            vec<int>::vec<int>(&local_58,pvVar15);
            vec<int>::vec<int>(&local_68,local_158);
            local_160 = pCVar10;
            explainAcantreachB(this,pCVar10,2,&local_58,&local_68,-1,-1);
            if (local_68.data != (int *)0x0) {
              free(local_68.data);
            }
            local_68.data = (int *)0x0;
            if (local_58.data != (int *)0x0) {
              free(local_58.data);
            }
            local_58.data = (int *)0x0;
            uVar6 = local_158->sz;
            uVar1 = pvVar15->sz;
            vec<int>::vec<int>(&local_78,local_a0);
            uVar13 = (ulong)local_1b8 & 0xffffffff;
            local_100.sz = local_1b8._0_4_;
            local_100.cap = local_1b8._0_4_;
            local_100.data = (int *)malloc(uVar13 * 4);
            if (uVar13 != 0) {
              uVar12 = 0;
              do {
                local_100.data[uVar12] = uStack_1b0[uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar13 != uVar12);
            }
            explainAcantreachB(this,local_160,uVar6 * uVar1 + 2,&local_78,&local_100,-1,-1);
            if (local_100.data != (int *)0x0) {
              free(local_100.data);
            }
            local_100.data = (int *)0x0;
            if (local_78.data != (int *)0x0) {
              free(local_78.data);
            }
            local_78.data = (int *)0x0;
            pCVar10 = local_160;
            if (uStack_1b0 != (int *)0x0) {
              free(uStack_1b0);
              pCVar10 = local_160;
            }
          }
          else {
            pCVar10 = (Clause *)0x0;
          }
          uStack_1b0 = (int *)CONCAT44(thisNode_00,thisNode);
          local_1a8 = false;
          local_1b8 = (undefined1  [8])pCVar10;
          vec<SubCircuit<4>::PROP>::push(local_138,(PROP *)local_1b8);
          pIVar16 = local_150;
        }
      }
      if (this->index[lVar17] < this->lowlink[thisNode]) {
        this->lowlink[thisNode] = this->index[lVar17];
      }
    }
    iVar7 = -0x80000000;
    if (iVar9 != (local_80->max).v) {
      pTVar11 = local_80->vals + local_38;
      do {
        pTVar11 = pTVar11 + 1;
        iVar9 = iVar9 + 1;
        iVar7 = iVar9;
      } while (pTVar11->v == '\0');
    }
  } while( true );
}

Assistant:

bool exploreSubtree(int thisNode, int startPrevSubtree, int endPrevSubtree, int* backfrom,
											int* backto, int* numback) {
		// fprintf(stderr,"exploring subtree\n");
		index[thisNode] = nodesSeen++;
		lowlink[thisNode] = index[thisNode];
		bool isFirstChild = true;
		int child;
		for (typename IntView<U>::iterator i = x[thisNode].begin(); i != x[thisNode].end(); ++i) {
			child = *i;
			// If we haven't visited the child yet, do so now
			if (index[child] == -1) {
				// fprintf(stderr,"new child %d\n", child);
				if (!exploreSubtree(child, startPrevSubtree, endPrevSubtree, backfrom, backto, numback)) {
					return false;  // fail if there was an scc contained within this child
				}

				if (lowlink[child] < lowlink[thisNode]) {
					lowlink[thisNode] = lowlink[child];
				}

				// If this is the first child and its lowlink is equal to the
				// parent's index, we can prune the edge from this node to the
				// child (as the circuit must come back up through an edge from
				// the child to this node and therefore can't go in the other
				// direction). We can do this as long as there is a node outside
				// the child and this node which has to be in.
				// We can also prune any edges from a node outside the child's
				// subtree to this node, as long as something inside the child has to be in.
				if (pruneWithin && isFirstChild && lowlink[child] == index[thisNode]) {
					// XXX [AS] Commented following line, because propagator related statistics
					// should be collected within the propagator class.
					// engine.prunedGeneralise++;
					// The reason is that no node in the child's subtree reaches a node outside the subtree
					// that isn't the parent, and at least one node in the child's subtree is in the circuit
					// First divide the nodes into those inside and outside the child's subtree
					vec<int> inside;
					vec<int> outside;
					for (int i = 0; i < size; i++) {
						if (index[i] >= index[child]) {
							inside.push(i);
						} else if (index[i] != index[thisNode]) {
							outside.push(i);
						}
					}

					// Now check one node is definitely in
					const Lit evidenceIn = getEvidenceLit(inside);
					const Lit evidenceOut = getEvidenceLit(outside);
					if (evidenceOut != lit_True) {
						Clause* r = nullptr;
						if (so.lazy) {
							r = Reason_new(inside.size() * outside.size() + 2);
							(*r)[1] = evidenceOut;
							explainAcantreachB(r, 2, inside, outside);
						}
						addPropagation(false, thisNode, child, r);
					}
					if (evidenceIn != lit_True) {
						Clause* r = nullptr;
						if (so.lazy) {
							r = Reason_new(inside.size() * outside.size() + 2);
							(*r)[1] = evidenceIn;
							explainAcantreachB(r, 2, inside, outside);
						}
						for (unsigned int i = 0; i < outside.size(); i++) {
							if (x[outside[i]].indomain(thisNode)) {
								addPropagation(false, outside[i], thisNode, r);
							}
						}
					}
				}

				isFirstChild = false;        // We've now visited at least one child
			} else if (child != thisNode)  // This is a node we've seen before (ignore self-cycle edges)
			{
				// fprintf(stderr,"old child %d\n", child);
				//  If child is within the last subtree we've found a backedge (from this node to the child)
				if (index[child] >= startPrevSubtree && index[child] <= endPrevSubtree) {
					(*numback)++;
					*backfrom = thisNode;
					*backto = child;
				}

				// If w is from a subtree before the previous one prune this edge (if that option is set)
				if (pruneSkip && index[child] < startPrevSubtree) {
					const Lit evidence = getEvidenceLit(prev);
					if (evidence != lit_True) {
						// XXX [AS] Commented following line, because propagator related statistics
						// should be collected within the propagator class.
						// engine.prunedSkip++;
						Clause* r = nullptr;
						if (so.lazy) {
							// The reason is that no node in an earlier
							// subtree can reach the prev or later subtrees,
							// and no node in the prev subtree can reach
							// later subtrees.
							vec<int> prevAndLater;
							prevAndLater.reserve(prev.size() + later.size());
							for (unsigned int i = 0; i < prev.size(); i++) {
								prevAndLater.push(prev[i]);
							}
							for (unsigned int i = 0; i < later.size(); i++) {
								prevAndLater.push(later[i]);
							}
							r = Reason_new(earlier.size() * prevAndLater.size() + prev.size() * later.size() + 2);
							(*r)[1] = evidence;
							explainAcantreachB(r, 2, prev, later);
							explainAcantreachB(r, prev.size() * later.size() + 2, earlier, prevAndLater);
						}
						addPropagation(false, thisNode, child, r);
					}
				}

				if (index[child] < lowlink[thisNode]) {
					lowlink[thisNode] = index[child];
				}
			}
			// fprintf(stderr,"lowpoint is %d\n", lowlink[thisNode]);
		}

		// Fail if there's an scc rooted here
		if (lowlink[thisNode] == index[thisNode]) {
			// The reason is that no node in the subtree rooted by this
			// one (including this one)
			// reaches a node outside that subtree, and some node inside
			// the subtree (not including this node) is required in the circuit.
			// Start by finding the nodes inside and outside the subtree.
			vec<int> inside;
			vec<int> outside;

			for (int i = 0; i < size; i++) {
				if (index[i] > index[thisNode]) {
					inside.push(i);
				} else if (i != thisNode) {
					outside.push(i);
				}
			}

			const Lit evidenceInside = getEvidenceLit(inside);  // at this point inside excludes this node

			inside.push(thisNode);  // now include this node

			// Set all vars outside the component to be self-cycles
			if (evidenceInside != lit_True) {
				Clause* r = nullptr;
				if (so.lazy) {
					r = Reason_new(inside.size() * outside.size() + 2);
					(*r)[1] = evidenceInside;

					explainAcantreachB(r, 2, inside, outside);
				}
				for (unsigned int i = 0; i < outside.size(); i++) {
					const int varOutside = outside[i];
					if (x[varOutside].setValNotR(varOutside)) {
						// XXX [AS] Commented following line, because propagator related statistics
						// should be collected within the propagator class.
						// engine.multipleSCC++;
						addPropagation(true, varOutside, varOutside, r);
						/* if(!x[varOutside].setVal(varOutside, r))
						 {
						 fprintf(stderr, "failing\n");
								 return false;
						 }*/
					}
				}
			}
		}

		return true;
	}